

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * wasm::Path::getBinaryenBinaryTool(string *__return_storage_ptr__,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  getBinaryenBinDir_abi_cxx11_();
  std::operator+(__return_storage_ptr__,&local_40,name);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string getBinaryenBinaryTool(const std::string& name) {
  return getBinaryenBinDir() + name;
}